

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.hpp
# Opt level: O0

Sheet * __thiscall Excel::Book::sheet(Book *this,size_t index)

{
  size_type sVar1;
  pointer pSVar2;
  wstring *what;
  undefined8 uVar3;
  ulong in_RSI;
  Exception *in_RDI;
  wstringstream stream;
  unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_> *in_stack_fffffffffffffe10;
  wstringstream local_198 [16];
  wostream local_188 [376];
  size_type local_10;
  
  local_10 = in_RSI;
  sVar1 = std::
          vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
          ::size((vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
                  *)&in_RDI->field_0x8);
  if (in_RSI < sVar1) {
    std::
    vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
    ::operator[]((vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
                  *)&in_RDI->field_0x8,local_10);
    pSVar2 = std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>::get
                       (in_stack_fffffffffffffe10);
    return pSVar2;
  }
  std::__cxx11::wstringstream::wstringstream(local_198);
  what = (wstring *)std::operator<<(local_188,L"There is no such sheet with index : ");
  std::wostream::operator<<((wostream *)what,local_10);
  uVar3 = __cxa_allocate_exception(0x30);
  std::__cxx11::wstringstream::str();
  Exception::Exception(in_RDI,what);
  __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline Sheet *
Book::sheet( size_t index ) const
{
	if( index < m_sheets.size() )
		return m_sheets[ index ].get();

	std::wstringstream stream;
	stream << L"There is no such sheet with index : " << index;

	throw Exception( stream.str() );
}